

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::declareBlock
          (HlslParseContext *this,TSourceLoc *loc,TType *type,TString *instanceName)

{
  TType *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  TTypeList *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TArraySizes *s;
  size_type sVar5;
  reference pvVar6;
  TQualifier *pTVar7;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  pointer ppVar8;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  TVariable *this_01;
  undefined4 extraout_var_23;
  char *pcVar9;
  bool bVar10;
  TSpirvType *local_258;
  TVariable *variable;
  TType blockType;
  TString *interfaceName;
  TQualifier newMemberQualification;
  TSourceLoc *memberLoc_1;
  TQualifier *memberQualifier_1;
  uint member_1;
  bool memberWithoutLocation;
  bool memberWithLocation;
  TQualifier defaultQualification;
  _Self local_70;
  _Self local_68;
  TTypeList *local_60;
  _Self local_58;
  iterator it;
  TSourceLoc *memberLoc;
  TQualifier *memberQualifier;
  TType *memberType;
  uint member;
  TTypeList *typeList;
  TString *instanceName_local;
  TType *type_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  undefined4 extraout_var_03;
  
  pTVar4 = TType::getWritableStruct(type);
  if (pTVar4 != (TTypeList *)0x0) {
    iVar2 = (*type->_vptr_TType[10])();
    uVar3 = *(uint *)(CONCAT44(extraout_var,iVar2) + 8) & 0x7f;
    if (uVar3 == 3) {
      iVar2 = (*type->_vptr_TType[10])();
      correctInput(this,(TQualifier *)CONCAT44(extraout_var_01,iVar2));
    }
    else if (uVar3 == 4) {
      iVar2 = (*type->_vptr_TType[10])();
      correctOutput(this,(TQualifier *)CONCAT44(extraout_var_02,iVar2));
    }
    else if (uVar3 == 5 || uVar3 == 6) {
      iVar2 = (*type->_vptr_TType[10])();
      correctUniform(this,(TQualifier *)CONCAT44(extraout_var_00,iVar2));
    }
    s = (TArraySizes *)TType::getWritableStruct(type);
    for (memberType._4_4_ = 0;
        sVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                          ((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *
                           )s), memberType._4_4_ < sVar5; memberType._4_4_ = memberType._4_4_ + 1) {
      pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[]((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
                          s,(ulong)memberType._4_4_);
      this_00 = pvVar6->type;
      iVar2 = (*this_00->_vptr_TType[10])();
      pTVar7 = (TQualifier *)CONCAT44(extraout_var_03,iVar2);
      pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[]((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
                          s,(ulong)memberType._4_4_);
      it._M_node = (_Base_ptr)&pvVar6->loc;
      globalQualifierFix(this,(TSourceLoc *)it._M_node,pTVar7);
      iVar2 = (*type->_vptr_TType[10])();
      *(ulong *)&pTVar7->field_0x8 =
           *(ulong *)&pTVar7->field_0x8 & 0xffffffffffffff80 |
           (ulong)((uint)*(undefined8 *)(CONCAT44(extraout_var_04,iVar2) + 8) & 0x7f);
      uVar3 = (*this_00->_vptr_TType[0x25])();
      if ((uVar3 & 1) != 0) {
        local_60 = TType::getStruct(this_00);
        local_58._M_node =
             (_Base_ptr)
             std::
             map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
             ::find(&(this->ioTypeMap).
                     super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                    ,&local_60);
        iVar2 = (*type->_vptr_TType[10])();
        uVar3 = *(uint *)(CONCAT44(extraout_var_05,iVar2) + 8) & 0x7f;
        if (uVar3 == 3) {
          iVar2 = (*type->_vptr_TType[10])();
          correctInput(this,(TQualifier *)CONCAT44(extraout_var_07,iVar2));
          local_70._M_node =
               (_Base_ptr)
               std::
               map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
               ::end(&(this->ioTypeMap).
                      super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                    );
          bVar1 = std::operator!=(&local_58,&local_70);
          bVar10 = false;
          if (bVar1) {
            ppVar8 = std::
                     _Rb_tree_iterator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>
                     ::operator->(&local_58);
            bVar10 = (ppVar8->second).input != (TTypeList *)0x0;
          }
          if (bVar10) {
            ppVar8 = std::
                     _Rb_tree_iterator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>
                     ::operator->(&local_58);
            TType::setStruct(this_00,(ppVar8->second).input);
          }
        }
        else if (uVar3 == 4) {
          iVar2 = (*type->_vptr_TType[10])();
          correctOutput(this,(TQualifier *)CONCAT44(extraout_var_08,iVar2));
          defaultQualification._72_8_ =
               std::
               map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
               ::end(&(this->ioTypeMap).
                      super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                    );
          bVar1 = std::operator!=(&local_58,(_Self *)&defaultQualification.layoutBindlessSampler);
          bVar10 = false;
          if (bVar1) {
            ppVar8 = std::
                     _Rb_tree_iterator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>
                     ::operator->(&local_58);
            bVar10 = (ppVar8->second).output != (TTypeList *)0x0;
          }
          if (bVar10) {
            ppVar8 = std::
                     _Rb_tree_iterator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>
                     ::operator->(&local_58);
            TType::setStruct(this_00,(ppVar8->second).output);
          }
        }
        else if (uVar3 == 5 || uVar3 == 6) {
          iVar2 = (*type->_vptr_TType[10])();
          correctUniform(this,(TQualifier *)CONCAT44(extraout_var_06,iVar2));
          local_68._M_node =
               (_Base_ptr)
               std::
               map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
               ::end(&(this->ioTypeMap).
                      super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                    );
          bVar1 = std::operator!=(&local_58,&local_68);
          bVar10 = false;
          if (bVar1) {
            ppVar8 = std::
                     _Rb_tree_iterator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>
                     ::operator->(&local_58);
            bVar10 = (ppVar8->second).uniform != (TTypeList *)0x0;
          }
          if (bVar10) {
            ppVar8 = std::
                     _Rb_tree_iterator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>
                     ::operator->(&local_58);
            TType::setStruct(this_00,(ppVar8->second).uniform);
          }
        }
      }
    }
    iVar2 = (*type->_vptr_TType[10])();
    switch(*(uint *)(CONCAT44(extraout_var_09,iVar2) + 8) & 0x7f) {
    case 3:
      memcpy(&member_1,&this->globalInputDefaults,0x50);
      break;
    case 4:
      memcpy(&member_1,&this->globalOutputDefaults,0x50);
      break;
    case 5:
      memcpy(&member_1,&this->globalUniformDefaults,0x50);
      break;
    case 6:
      memcpy(&member_1,&this->globalBufferDefaults,0x50);
      break;
    default:
      TQualifier::clear((TQualifier *)&member_1);
    }
    iVar2 = (*type->_vptr_TType[10])();
    if ((*(byte *)(CONCAT44(extraout_var_10,iVar2) + 0x2d) & 1) != 0) {
      iVar2 = (*type->_vptr_TType[10])();
      bVar10 = TQualifier::hasPacking((TQualifier *)CONCAT44(extraout_var_11,iVar2));
      if (!bVar10) {
        iVar2 = (*type->_vptr_TType[10])();
        *(byte *)(CONCAT44(extraout_var_12,iVar2) + 0x10) =
             *(byte *)(CONCAT44(extraout_var_12,iVar2) + 0x10) & 0xf0 | 3;
      }
    }
    iVar2 = (*type->_vptr_TType[10])();
    mergeObjectLayoutQualifiers
              (this,(TQualifier *)&member_1,(TQualifier *)CONCAT44(extraout_var_13,iVar2),true);
    memberQualifier_1._7_1_ = false;
    memberQualifier_1._6_1_ = false;
    for (memberQualifier_1._0_4_ = 0;
        sVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                          ((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *
                           )s), (uint)memberQualifier_1 < sVar5;
        memberQualifier_1._0_4_ = (uint)memberQualifier_1 + 1) {
      pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[]((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
                          s,(ulong)(uint)memberQualifier_1);
      iVar2 = (*pvVar6->type->_vptr_TType[10])();
      pTVar7 = (TQualifier *)CONCAT44(extraout_var_14,iVar2);
      pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[]((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
                          s,(ulong)(uint)memberQualifier_1);
      newMemberQualification._72_8_ = &pvVar6->loc;
      bVar10 = TQualifier::hasStream(pTVar7);
      if ((bVar10) &&
         (defaultQualification.layoutAlign._3_1_ !=
          (char)((ulong)*(undefined8 *)&pTVar7->field_0x1c >> 0x38))) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,newMemberQualification._72_8_,"member cannot contradict block","stream","");
      }
      bVar10 = TQualifier::hasXfbBuffer(pTVar7);
      if ((bVar10) &&
         ((defaultQualification._28_4_ & 0xf) != ((uint)*(undefined8 *)&pTVar7->field_0x24 & 0xf)))
      {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,newMemberQualification._72_8_,
                   "member cannot contradict block (or what block inherited from global)",
                   "xfb_buffer","");
      }
      bVar10 = TQualifier::hasLocation(pTVar7);
      if (bVar10) {
        iVar2 = (*type->_vptr_TType[10])();
        uVar3 = *(uint *)(CONCAT44(extraout_var_15,iVar2) + 8) & 0x7f;
        if (uVar3 == 3 || uVar3 == 4) {
          memberQualifier_1._7_1_ = true;
        }
      }
      else {
        memberQualifier_1._6_1_ = true;
      }
      memcpy(&interfaceName,&member_1,0x50);
      mergeQualifiers(this,(TQualifier *)&interfaceName,pTVar7);
      memcpy(pTVar7,&interfaceName,0x50);
    }
    iVar2 = (*type->_vptr_TType[10])();
    fixBlockLocations(this,loc,(TQualifier *)CONCAT44(extraout_var_16,iVar2),(TTypeList *)s,
                      memberQualifier_1._7_1_,memberQualifier_1._6_1_);
    iVar2 = (*type->_vptr_TType[10])();
    fixXfbOffsets(this,(TQualifier *)CONCAT44(extraout_var_17,iVar2),(TTypeList *)s);
    iVar2 = (*type->_vptr_TType[10])();
    fixBlockUniformOffsets(this,(TQualifier *)CONCAT44(extraout_var_18,iVar2),(TTypeList *)s);
    iVar2 = (*type->_vptr_TType[10])();
    mergeObjectLayoutQualifiers
              (this,(TQualifier *)CONCAT44(extraout_var_19,iVar2),(TQualifier *)&member_1,true);
    if ((instanceName == (TString *)0x0) ||
       (bVar10 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::empty
                           (instanceName), local_258 = (TSpirvType *)instanceName, bVar10)) {
      iVar2 = (*type->_vptr_TType[5])();
      local_258 = (TSpirvType *)CONCAT44(extraout_var_20,iVar2);
    }
    blockType.spirvType = local_258;
    iVar2 = (*type->_vptr_TType[10])();
    TType::TType((TType *)&variable,(TTypeList *)s,(TString *)local_258,
                 (TQualifier *)CONCAT44(extraout_var_21,iVar2));
    uVar3 = (*type->_vptr_TType[0x1d])();
    if ((uVar3 & 1) != 0) {
      iVar2 = (*type->_vptr_TType[0x14])();
      s = (TArraySizes *)CONCAT44(extraout_var_22,iVar2);
      TType::transferArraySizes((TType *)&variable,s);
    }
    typeList = (TTypeList *)instanceName;
    if (instanceName == (TString *)0x0) {
      typeList = (TTypeList *)NewPoolTString_abi_cxx11_("");
    }
    this_01 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,(size_t)s);
    TVariable::TVariable(this_01,(TString *)typeList,(TType *)&variable,false);
    bVar10 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_01);
    if (bVar10) {
      bVar10 = TSymbolTable::atGlobalLevel((this->super_TParseContextBase).symbolTable);
      if (bVar10) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                  (this,this_01);
      }
    }
    else {
      bVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                *)typeList,"");
      if (bVar10) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,
                   "nameless block contains a member that already has a name at global scope","");
      }
      else {
        iVar2 = (*(this_01->super_TSymbol)._vptr_TSymbol[3])();
        pcVar9 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var_23,iVar2));
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"block instance name redefinition",pcVar9,"");
      }
    }
    TType::~TType((TType *)&variable);
    return;
  }
  __assert_fail("type.getWritableStruct() != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                ,0x224e,
                "void glslang::HlslParseContext::declareBlock(const TSourceLoc &, TType &, const TString *)"
               );
}

Assistant:

void HlslParseContext::declareBlock(const TSourceLoc& loc, TType& type, const TString* instanceName)
{
    assert(type.getWritableStruct() != nullptr);

    // Clean up top-level decorations that don't belong.
    switch (type.getQualifier().storage) {
    case EvqUniform:
    case EvqBuffer:
        correctUniform(type.getQualifier());
        break;
    case EvqVaryingIn:
        correctInput(type.getQualifier());
        break;
    case EvqVaryingOut:
        correctOutput(type.getQualifier());
        break;
    default:
        break;
    }

    TTypeList& typeList = *type.getWritableStruct();
    // fix and check for member storage qualifiers and types that don't belong within a block
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TType& memberType = *typeList[member].type;
        TQualifier& memberQualifier = memberType.getQualifier();
        const TSourceLoc& memberLoc = typeList[member].loc;
        globalQualifierFix(memberLoc, memberQualifier);
        memberQualifier.storage = type.getQualifier().storage;

        if (memberType.isStruct()) {
            // clean up and pick up the right set of decorations
            auto it = ioTypeMap.find(memberType.getStruct());
            switch (type.getQualifier().storage) {
            case EvqUniform:
            case EvqBuffer:
                correctUniform(type.getQualifier());
                if (it != ioTypeMap.end() && it->second.uniform)
                    memberType.setStruct(it->second.uniform);
                break;
            case EvqVaryingIn:
                correctInput(type.getQualifier());
                if (it != ioTypeMap.end() && it->second.input)
                    memberType.setStruct(it->second.input);
                break;
            case EvqVaryingOut:
                correctOutput(type.getQualifier());
                if (it != ioTypeMap.end() && it->second.output)
                    memberType.setStruct(it->second.output);
                break;
            default:
                break;
            }
        }
    }

    // Make default block qualification, and adjust the member qualifications

    TQualifier defaultQualification;
    switch (type.getQualifier().storage) {
    case EvqUniform:    defaultQualification = globalUniformDefaults;    break;
    case EvqBuffer:     defaultQualification = globalBufferDefaults;     break;
    case EvqVaryingIn:  defaultQualification = globalInputDefaults;      break;
    case EvqVaryingOut: defaultQualification = globalOutputDefaults;     break;
    default:            defaultQualification.clear();                    break;
    }

    // Special case for "push_constant uniform", which has a default of std430,
    // contrary to normal uniform defaults, and can't have a default tracked for it.
    if (type.getQualifier().layoutPushConstant && ! type.getQualifier().hasPacking())
        type.getQualifier().layoutPacking = ElpStd430;

    // fix and check for member layout qualifiers

    mergeObjectLayoutQualifiers(defaultQualification, type.getQualifier(), true);

    bool memberWithLocation = false;
    bool memberWithoutLocation = false;
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TQualifier& memberQualifier = typeList[member].type->getQualifier();
        const TSourceLoc& memberLoc = typeList[member].loc;
        if (memberQualifier.hasStream()) {
            if (defaultQualification.layoutStream != memberQualifier.layoutStream)
                error(memberLoc, "member cannot contradict block", "stream", "");
        }

        // "This includes a block's inheritance of the
        // current global default buffer, a block member's inheritance of the block's
        // buffer, and the requirement that any *xfb_buffer* declared on a block
        // member must match the buffer inherited from the block."
        if (memberQualifier.hasXfbBuffer()) {
            if (defaultQualification.layoutXfbBuffer != memberQualifier.layoutXfbBuffer)
                error(memberLoc, "member cannot contradict block (or what block inherited from global)", "xfb_buffer", "");
        }

        if (memberQualifier.hasLocation()) {
            switch (type.getQualifier().storage) {
            case EvqVaryingIn:
            case EvqVaryingOut:
                memberWithLocation = true;
                break;
            default:
                break;
            }
        } else
            memberWithoutLocation = true;

        TQualifier newMemberQualification = defaultQualification;
        mergeQualifiers(newMemberQualification, memberQualifier);
        memberQualifier = newMemberQualification;
    }

    // Process the members
    fixBlockLocations(loc, type.getQualifier(), typeList, memberWithLocation, memberWithoutLocation);
    fixXfbOffsets(type.getQualifier(), typeList);
    fixBlockUniformOffsets(type.getQualifier(), typeList);

    // reverse merge, so that currentBlockQualifier now has all layout information
    // (can't use defaultQualification directly, it's missing other non-layout-default-class qualifiers)
    mergeObjectLayoutQualifiers(type.getQualifier(), defaultQualification, true);

    //
    // Build and add the interface block as a new type named 'blockName'
    //

    // Use the instance name as the interface name if one exists, else the block name.
    const TString& interfaceName = (instanceName && !instanceName->empty()) ? *instanceName : type.getTypeName();

    TType blockType(&typeList, interfaceName, type.getQualifier());
    if (type.isArray())
        blockType.transferArraySizes(type.getArraySizes());

    // Add the variable, as anonymous or named instanceName.
    // Make an anonymous variable if no name was provided.
    if (instanceName == nullptr)
        instanceName = NewPoolTString("");

    TVariable& variable = *new TVariable(instanceName, blockType);
    if (! symbolTable.insert(variable)) {
        if (*instanceName == "")
            error(loc, "nameless block contains a member that already has a name at global scope",
                  "" /* blockName->c_str() */, "");
        else
            error(loc, "block instance name redefinition", variable.getName().c_str(), "");

        return;
    }

    // Save it in the AST for linker use.
    if (symbolTable.atGlobalLevel())
        trackLinkage(variable);
}